

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegexpExec(xmlRegexpPtr comp,xmlChar *content)

{
  xmlRegTrans *pxVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegCounter *pxVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  xmlRegStatePtr pxVar8;
  xmlRegStatePtr extraout_RAX;
  bool bVar9;
  int iVar10;
  long lVar11;
  int i;
  long lVar12;
  bool bVar13;
  int len;
  xmlRegExecCtxt execval;
  uint local_dc;
  xmlRegExecCtxt local_d8;
  xmlRegexpPtr local_40;
  xmlRegStatePtr local_38;
  
  if (content == (xmlChar *)0x0 || comp == (xmlRegexpPtr)0x0) {
    return -1;
  }
  local_d8.index = 0;
  local_d8.nbPush = 0;
  local_d8.status = 0;
  local_d8.determinist = 1;
  local_d8.maxRollbacks = 0;
  local_d8.nbRollbacks = 0;
  local_d8.rollbacks = (xmlRegExecRollback *)0x0;
  local_d8.state = *comp->states;
  local_d8.transno = 0;
  local_d8.transcount = 0;
  local_d8.inputStack = (xmlRegInputTokenPtr)0x0;
  local_d8.inputStackMax = 0;
  local_d8.comp = comp;
  local_d8.inputString = content;
  if ((long)comp->nbCounters < 1) {
    local_d8.counts = (int *)0x0;
  }
  else {
    local_d8.counts = (int *)(*xmlMalloc)((long)comp->nbCounters << 2);
    if ((xmlRegStatePtr)local_d8.counts == (xmlRegStatePtr)0x0) {
      xmlRegexpErrMemory((xmlRegParserCtxtPtr)0x0,"running regexp");
      return -1;
    }
    memset(local_d8.counts,0,(long)comp->nbCounters << 2);
  }
  do {
    if (((local_d8.status != 0) || (local_d8.state == (xmlRegStatePtr)0x0)) ||
       ((local_d8.inputString[local_d8.index] == '\0' &&
        ((local_d8.state)->type == XML_REGEXP_FINAL_STATE)))) goto LAB_001a3fe2;
    local_dc = 1;
    if (((local_d8.inputString[local_d8.index] == '\0') &&
        ((xmlRegStatePtr)local_d8.counts == (xmlRegStatePtr)0x0)) &&
       (((local_d8.state)->nbTrans <= local_d8.transno ||
        ((-1 < (local_d8.state)->trans[local_d8.transno].to &&
         ((pxVar2 = (local_d8.state)->trans[local_d8.transno].atom, pxVar2->min != 0 ||
          (pxVar2->max < 1)))))))) {
LAB_001a3f8e:
      local_d8._0_8_ = local_d8._0_8_ & 0xffffffff;
      xmlFARegExecRollBack(&local_d8);
      iVar6 = 2;
      pxVar8 = extraout_RAX;
    }
    else {
      local_d8.transcount = 0;
      for (; local_d8.transno < (local_d8.state)->nbTrans; local_d8.transno = local_d8.transno + 1)
      {
        if (-1 < (local_d8.state)->trans[local_d8.transno].to) {
          pxVar1 = (local_d8.state)->trans + local_d8.transno;
          lVar11 = (long)pxVar1->count;
          if (lVar11 < 0) {
            pxVar2 = pxVar1->atom;
            if (pxVar2 == (xmlRegAtomPtr)0x0) {
              xmlRegexpExec_cold_1();
              break;
            }
            if (local_d8.inputString[local_d8.index] != '\0') {
              iVar6 = xmlStringCurrentChar
                                ((xmlParserCtxtPtr)0x0,local_d8.inputString + local_d8.index,
                                 (int *)&local_dc);
              uVar7 = xmlRegCheckCharacter(pxVar2,iVar6);
              bVar13 = true;
              if (uVar7 != 0) {
                if (((uVar7 != 1) || (pxVar2->min < 0)) || (pxVar2->max < 1)) goto LAB_001a3ce9;
                local_38 = comp->states[pxVar1->to];
                lVar11 = (long)pxVar1->counter;
                local_40 = comp;
                if (lVar11 < 0) {
LAB_001a3df6:
                  if (local_d8.transno + 1 < (local_d8.state)->nbTrans) {
                    xmlFARegExecSave(&local_d8);
                  }
                  if (-1 < (long)pxVar1->counter) {
                    ((xmlRegStateType *)local_d8.counts)[pxVar1->counter] =
                         ((xmlRegStateType *)local_d8.counts)[pxVar1->counter] +
                         XML_REGEXP_START_STATE;
                  }
                  local_d8.transcount = 1;
                  do {
                    iVar6 = local_d8.transno;
                    pxVar8 = local_d8.state;
                    uVar7 = 1;
                    if ((local_d8.transcount == pxVar2->max) ||
                       (iVar10 = (int)((long)(int)local_dc + (long)local_d8.index),
                       local_d8.inputString[(long)(int)local_dc + (long)local_d8.index] == '\0'))
                    break;
                    local_d8.index = iVar10;
                    if (pxVar2->min <= local_d8.transcount) {
                      local_d8.transno = -1;
                      local_d8.state = local_38;
                      xmlFARegExecSave(&local_d8);
                    }
                    local_d8.state = pxVar8;
                    local_d8.transno = iVar6;
                    iVar6 = xmlStringCurrentChar
                                      ((xmlParserCtxtPtr)0x0,local_d8.inputString + local_d8.index,
                                       (int *)&local_dc);
                    uVar7 = xmlRegCheckCharacter(pxVar2,iVar6);
                    local_d8.transcount = local_d8.transcount + 1;
                  } while (uVar7 == 1);
                  if (local_d8.transcount < pxVar2->min) {
                    uVar7 = 0;
                  }
                  uVar5 = uVar7;
                  if ((int)uVar7 < 1) {
                    uVar5 = 0;
                  }
                  pxVar8 = (xmlRegStatePtr)(ulong)uVar5;
                  if ((int)uVar7 < 1) {
                    iVar6 = 4;
                    pxVar8 = (xmlRegStatePtr)0x0;
                  }
                  else {
                    iVar6 = 0;
                    if (-1 < (long)pxVar1->counter) {
                      if ((xmlRegStatePtr)local_d8.counts == (xmlRegStatePtr)0x0) {
                        local_d8.status = 0xffffffff;
                        iVar6 = 8;
                      }
                      else {
                        ((xmlRegStateType *)local_d8.counts)[pxVar1->counter] =
                             ((xmlRegStateType *)local_d8.counts)[pxVar1->counter] -
                             XML_REGEXP_START_STATE;
                      }
                    }
                  }
                }
                else {
                  if ((((xmlRegStatePtr)local_d8.counts == (xmlRegStatePtr)0x0) ||
                      (local_d8.comp == (xmlRegexpPtr)0x0)) ||
                     ((local_d8.comp)->counters == (xmlRegCounter *)0x0)) {
                    local_d8.status = 0xffffffff;
                    iVar6 = 8;
                    bVar9 = false;
                  }
                  else {
                    iVar10 = (local_d8.comp)->counters[lVar11].max;
                    bVar9 = (int)((xmlRegStateType *)local_d8.counts)[lVar11] < iVar10;
                    iVar6 = 7;
                    if ((int)((xmlRegStateType *)local_d8.counts)[lVar11] < iVar10) {
                      iVar6 = 0;
                    }
                  }
                  pxVar8 = (xmlRegStatePtr)&DAT_00000001;
                  if (bVar9) goto LAB_001a3df6;
                }
                comp = local_40;
                uVar7 = (uint)pxVar8;
                if (iVar6 == 0) goto LAB_001a3ce9;
                if (iVar6 == 7) goto LAB_001a3d5c;
                if (iVar6 != 4) goto LAB_001a3fa3;
                goto LAB_001a3f8e;
              }
            }
            bVar13 = true;
            uVar7 = 0;
            if ((pxVar2->min == 0) && (uVar7 = 0, 0 < pxVar2->max)) {
              local_d8.transcount = 1;
              local_dc = 0;
              uVar7 = 1;
            }
          }
          else {
            if ((xmlRegStatePtr)local_d8.counts == (xmlRegStatePtr)0x0) {
              local_d8.status = 0xffffffff;
              bVar13 = true;
              iVar6 = 8;
              bVar9 = false;
            }
            else {
              pxVar3 = (local_d8.comp)->counters;
              iVar6 = 0;
              bVar9 = false;
              if (pxVar3[lVar11].min <= (int)((xmlRegStateType *)local_d8.counts)[lVar11]) {
                bVar9 = (int)((xmlRegStateType *)local_d8.counts)[lVar11] <= pxVar3[lVar11].max;
              }
              bVar13 = true;
              if (bVar9 != false) {
                bVar13 = pxVar3[lVar11].min == pxVar3[lVar11].max;
              }
            }
            pxVar8 = (xmlRegStatePtr)local_d8.counts;
            if ((xmlRegStatePtr)local_d8.counts == (xmlRegStatePtr)0x0) goto LAB_001a3fa3;
            uVar7 = (uint)bVar9;
          }
LAB_001a3ce9:
          if (uVar7 == 1) {
            if ((pxVar1->nd == 1) ||
               (((!bVar13 && (-1 < pxVar1->count)) &&
                (local_d8.transno + 1 < (local_d8.state)->nbTrans)))) {
              xmlFARegExecSave(&local_d8);
            }
            pxVar8 = (xmlRegStatePtr)(long)pxVar1->counter;
            if (-1 < (long)pxVar8) {
              if ((((xmlRegStatePtr)local_d8.counts == (xmlRegStatePtr)0x0) ||
                  (local_d8.comp == (xmlRegexpPtr)0x0)) ||
                 ((local_d8.comp)->counters == (xmlRegCounter *)0x0)) {
                local_d8.status = 0xffffffff;
                iVar6 = 8;
              }
              else {
                iVar6 = 7;
                if ((int)((xmlRegStateType *)local_d8.counts)[(long)pxVar8] <
                    (local_d8.comp)->counters[(long)pxVar8].max) {
                  ((xmlRegStateType *)local_d8.counts)[(long)pxVar8] =
                       ((xmlRegStateType *)local_d8.counts)[(long)pxVar8] + XML_REGEXP_START_STATE;
                  iVar6 = 0;
                }
              }
              if (iVar6 == 7) goto LAB_001a3d5c;
              if (iVar6 != 0) goto LAB_001a3fa3;
            }
            pxVar8 = (xmlRegStatePtr)(ulong)(uint)pxVar1->count;
            if (pxVar8 < (xmlRegStatePtr)((long)&__DT_RELA[0x7d2].r_offset + 6)) {
              if ((xmlRegStatePtr)local_d8.counts == (xmlRegStatePtr)0x0) {
                local_d8.status = 0xffffffff;
                iVar6 = 8;
                goto LAB_001a3fa3;
              }
              ((xmlRegStateType *)local_d8.counts)[(long)pxVar8] = 0;
            }
            local_d8.state = comp->states[pxVar1->to];
            local_d8.transno = 0;
            iVar6 = 2;
            pxVar8 = local_d8.state;
            if (pxVar1->atom != (xmlRegAtomPtr)0x0) {
              pxVar8 = (xmlRegStatePtr)(ulong)local_dc;
              local_d8.index = local_d8.index + local_dc;
            }
            goto LAB_001a3fa3;
          }
          if ((int)uVar7 < 0) {
            local_d8.status = 0xfffffffc;
            break;
          }
        }
LAB_001a3d5c:
      }
      if ((local_d8.transno != 0) ||
         (iVar6 = 2, pxVar8 = local_d8.state, (local_d8.state)->nbTrans == 0)) goto LAB_001a3f8e;
    }
LAB_001a3fa3:
  } while (iVar6 == 2);
  if (iVar6 != 8) {
    return (int)pxVar8;
  }
LAB_001a3fe2:
  if (local_d8.rollbacks != (xmlRegExecRollback *)0x0) {
    if (((xmlRegStatePtr)local_d8.counts != (xmlRegStatePtr)0x0) && (0 < local_d8.maxRollbacks)) {
      lVar11 = 0x10;
      lVar12 = 0;
      do {
        pvVar4 = *(void **)((long)&(local_d8.rollbacks)->state + lVar11);
        if (pvVar4 != (void *)0x0) {
          (*xmlFree)(pvVar4);
        }
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x18;
      } while (lVar12 < local_d8.maxRollbacks);
    }
    (*xmlFree)(local_d8.rollbacks);
  }
  if (local_d8.state == (xmlRegStatePtr)0x0) {
    return -1;
  }
  if ((xmlRegStatePtr)local_d8.counts != (xmlRegStatePtr)0x0) {
    (*xmlFree)(local_d8.counts);
  }
  if (local_d8.status == 0) {
    return 1;
  }
  if (local_d8.status == -1) {
    return -(uint)(10000000 < local_d8.nbPush);
  }
  return local_d8.status;
}

Assistant:

int
xmlRegexpExec(xmlRegexpPtr comp, const xmlChar *content) {
    if ((comp == NULL) || (content == NULL))
	return(-1);
    return(xmlFARegExec(comp, content));
}